

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O3

void ggml::cpu::aarch64::gemv<block_iq4_nl,4l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  void *pvVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  void *local_70;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float sumf [4];
  
  if (3 < nc) {
    auVar21._8_4_ = 0xf;
    auVar21._0_8_ = 0xf0000000f;
    auVar21._12_4_ = 0xf;
    iVar12 = n + 0x1f;
    if (-1 < n) {
      iVar12 = n;
    }
    uVar11 = 0;
    lVar8 = (long)(iVar12 >> 5) * 0x48;
    local_60 = (long)vx + 8;
    local_70 = vx;
    do {
      local_58 = 0;
      uStack_50 = 0;
      if (0x1f < n) {
        uVar19 = 0;
        lVar16 = local_60;
        pvVar20 = local_70;
        do {
          lVar9 = uVar19 * 0x22;
          uVar1 = *(uint *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)vy + lVar9) * 4);
          lVar13 = 0;
          lVar18 = lVar16;
          do {
            auVar3 = vpmovsxbd_avx(ZEXT416(*(uint *)((long)vy + lVar13 * 4 + lVar9 + 2)));
            auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)((long)vy + lVar13 * 4 + lVar9 + 0x12)));
            lVar14 = 0;
            do {
              auVar22 = vpmovzxbd_avx(ZEXT416(*(uint *)(lVar18 + lVar14 * 4)));
              auVar2 = vpand_avx(auVar22,auVar21);
              auVar22 = vpsrld_avx(auVar22,4);
              auVar6 = vpmovzxdq_avx2(auVar2);
              auVar7 = vpmovzxdq_avx2(auVar22);
              lVar10 = vpextrq_avx(auVar6._0_16_,1);
              lVar17 = vpextrq_avx(auVar6._16_16_,1);
              auVar2 = vpinsrb_avx(ZEXT116((byte)kvalues_iq4nl[auVar6._0_8_]),
                                   (uint)(byte)kvalues_iq4nl[lVar10],1);
              auVar2 = vpinsrb_avx(auVar2,(uint)(byte)kvalues_iq4nl[auVar6._16_8_],2);
              lVar10 = vpextrq_avx(auVar7._0_16_,1);
              lVar15 = vpextrq_avx(auVar7._16_16_,1);
              auVar2 = vpinsrb_avx(auVar2,(uint)(byte)kvalues_iq4nl[lVar17],3);
              auVar22 = vpinsrb_avx(ZEXT116((byte)kvalues_iq4nl[auVar7._0_8_]),
                                    (uint)(byte)kvalues_iq4nl[lVar10],1);
              auVar22 = vpinsrb_avx(auVar22,(uint)(byte)kvalues_iq4nl[auVar7._16_8_],2);
              auVar22 = vpinsrb_avx(auVar22,(uint)(byte)kvalues_iq4nl[lVar15],3);
              auVar2 = vpmovsxbd_avx(auVar2);
              auVar5 = vpmulld_avx(auVar3,auVar2);
              auVar2 = vpmovsxbd_avx(auVar22);
              auVar2 = vpmulld_avx(auVar4,auVar2);
              auVar2 = vpaddd_avx(auVar5,auVar2);
              auVar2 = vphaddd_avx(auVar2,auVar2);
              auVar2 = vphaddd_avx(auVar2,auVar2);
              auVar2 = vcvtdq2ps_avx(auVar2);
              auVar2 = vfmadd213ss_fma(ZEXT416((uint)(auVar2._0_4_ *
                                                     *(float *)(&ggml_table_f32_f16 +
                                                               (ulong)*(ushort *)
                                                                       ((long)pvVar20 + lVar14 * 2)
                                                               * 4))),ZEXT416(uVar1),
                                       ZEXT416(*(uint *)((long)&local_58 + lVar14 * 4)));
              *(int *)((long)&local_58 + lVar14 * 4) = auVar2._0_4_;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            lVar13 = lVar13 + 1;
            lVar18 = lVar18 + 0x10;
          } while (lVar13 != 4);
          uVar19 = uVar19 + 1;
          lVar16 = lVar16 + 0x48;
          pvVar20 = (void *)((long)pvVar20 + 0x48);
        } while (uVar19 != (uint)(iVar12 >> 5));
      }
      lVar16 = uVar11 * 4;
      local_60 = local_60 + lVar8;
      local_70 = (void *)((long)local_70 + lVar8);
      uVar11 = uVar11 + 1;
      *(undefined8 *)(s + lVar16) = local_58;
      *(undefined8 *)(s + lVar16 + 2) = uStack_50;
    } while (uVar11 != (uint)nc >> 2);
  }
  return;
}

Assistant:

void gemv<block_iq4_nl, 4, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_iq4_nl_4x4_q8_0(n, s, bs, vx, vy, nr, nc);
}